

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O1

int AF_A_LeafCheck(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  VM_UBYTE VVar4;
  AActor *this;
  undefined8 *puVar5;
  AActor *pAVar6;
  PClass *pPVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined8 uVar10;
  PClass *pPVar11;
  AActor *pAVar12;
  VMValue *pVVar13;
  char *__assertion;
  bool bVar14;
  DAngle local_38;
  DAngle local_30;
  
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bad3b;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = (AActor *)(param->field_0).field_1.a;
    pVVar13 = param;
    uVar9 = numparam;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar8 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar8);
      }
      pPVar11 = (this->super_DThinker).super_DObject.Class;
      bVar14 = pPVar11 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar14;
      uVar9 = (uint)bVar14;
      pVVar13 = (VMValue *)(ulong)(pPVar11 == pPVar7 || bVar14);
      if (pPVar11 != pPVar7 && !bVar14) {
        do {
          pPVar11 = pPVar11->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar11 != (PClass *)0x0);
          if (pPVar11 == pPVar7) break;
        } while (pPVar11 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005bad3b;
      }
    }
    pPVar7 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar4 = param[1].field_0.field_3.Type, VVar4 != 0xff)) {
      if ((VVar4 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005bad10;
      puVar5 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar5 != (undefined8 *)0x0) {
        if (puVar5[1] == 0) {
          uVar10 = (**(code **)*puVar5)(puVar5,pVVar13,uVar9,ret);
          puVar5[1] = uVar10;
        }
        pPVar11 = (PClass *)puVar5[1];
        bVar14 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar7 && bVar14) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar14 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar7) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar14) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005bad3b;
        }
      }
    }
    if (((numparam < 3) || (VVar4 = param[2].field_0.field_3.Type, VVar4 == 0xff)) ||
       ((VVar4 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      iVar8 = this->special1;
      this->special1 = iVar8 + 1;
      if (iVar8 < 0x13) {
        pAVar6 = (this->target).field_0.p;
        pAVar12 = this;
        if (pAVar6 != (AActor *)0x0) {
          if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            pAVar12 = (this->target).field_0.p;
          }
          else {
            (this->target).field_0.p = (AActor *)0x0;
          }
        }
        dVar2 = (pAVar12->Angles).Yaw.Degrees;
        uVar9 = FRandom::GenRand32(&pr_leafcheck);
        if ((uVar9 & 0xff) < 0x41) {
          AActor::SetState(this,this->SpawnState + 7,false);
          uVar9 = FRandom::GenRand32(&pr_leafcheck);
          (this->Vel).Z = (double)(uVar9 & 0xff) * 0.0078125 + 1.0;
          local_38.Degrees = dVar2;
          uVar9 = FRandom::GenRand32(&pr_leafcheck);
          AActor::Thrust(this,&local_38,(double)(uVar9 & 0xff) * 0.0078125 + 2.0);
          pbVar1 = (byte *)((long)&(this->flags).Value + 2);
          *pbVar1 = *pbVar1 | 1;
        }
        else {
          dVar3 = (this->Vel).X;
          if ((((dVar3 == 0.0) && (!NAN(dVar3))) && (dVar3 = (this->Vel).Y, dVar3 == 0.0)) &&
             (!NAN(dVar3))) {
            local_30.Degrees = dVar2;
            uVar9 = FRandom::GenRand32(&pr_leafcheck);
            AActor::Thrust(this,&local_30,(double)(uVar9 & 0xff) * 0.0078125 + 1.0);
          }
        }
      }
      else {
        AActor::SetState(this,(FState *)0x0,false);
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005bad10:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005bad3b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x102,"int AF_A_LeafCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LeafCheck)
{
	PARAM_ACTION_PROLOGUE;

	self->special1++;
	if (self->special1 >= 20)
	{
		self->SetState (NULL);
		return 0;
	}
	DAngle ang = self->target ? self->target->Angles.Yaw : self->Angles.Yaw;
	if (pr_leafcheck() > 64)
	{
		if (self->Vel.X == 0 && self->Vel.Y == 0)
		{
			self->Thrust(ang, pr_leafcheck() / 128. + 1);
		}
		return 0;
	}
	self->SetState (self->SpawnState + 7);
	self->Vel.Z = pr_leafcheck() / 128. + 1;
	self->Thrust(ang, pr_leafcheck() / 128. + 2);
	self->flags |= MF_MISSILE;
	return 0;
}